

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserv_config.cpp
# Opt level: O0

void eoserv_config_validate_admin(Config *config)

{
  Config *config_local;
  
  eoserv_config_default<int>(config,"item",1);
  eoserv_config_default<int>(config,"npc",1);
  eoserv_config_default<int>(config,"spell",1);
  eoserv_config_default<int>(config,"class",1);
  eoserv_config_default<int>(config,"info",1);
  eoserv_config_default<int>(config,"paperdoll",1);
  eoserv_config_default<int>(config,"book",1);
  eoserv_config_default<int>(config,"inventory",1);
  eoserv_config_default<int>(config,"uptime",1);
  eoserv_config_default<int>(config,"kick",1);
  eoserv_config_default<int>(config,"skick",3);
  eoserv_config_default<int>(config,"jail",1);
  eoserv_config_default<int>(config,"unjail",1);
  eoserv_config_default<int>(config,"sjail",3);
  eoserv_config_default<int>(config,"ban",2);
  eoserv_config_default<int>(config,"sban",3);
  eoserv_config_default<int>(config,"mute",1);
  eoserv_config_default<int>(config,"smute",3);
  eoserv_config_default<int>(config,"warp",2);
  eoserv_config_default<int>(config,"warptome",2);
  eoserv_config_default<int>(config,"warpmeto",2);
  eoserv_config_default<int>(config,"hide",2);
  eoserv_config_default<int>(config,"show",2);
  eoserv_config_default<int>(config,"evacuate",3);
  eoserv_config_default<int>(config,"remap",4);
  eoserv_config_default<int>(config,"arena",1);
  eoserv_config_default<int>(config,"board",1);
  eoserv_config_default<int>(config,"shutdown",4);
  eoserv_config_default<int>(config,"rehash",4);
  eoserv_config_default<int>(config,"repub",4);
  eoserv_config_default<int>(config,"request",4);
  eoserv_config_default<int>(config,"sitem",3);
  eoserv_config_default<int>(config,"ditem",3);
  eoserv_config_default<int>(config,"snpc",3);
  eoserv_config_default<int>(config,"dnpc",3);
  eoserv_config_default<int>(config,"learn",3);
  eoserv_config_default<int>(config,"qstate",3);
  eoserv_config_default<int>(config,"quake",2);
  eoserv_config_default<int>(config,"setlevel",3);
  eoserv_config_default<int>(config,"setexp",3);
  eoserv_config_default<int>(config,"setstr",3);
  eoserv_config_default<int>(config,"setint",3);
  eoserv_config_default<int>(config,"setwis",3);
  eoserv_config_default<int>(config,"setagi",3);
  eoserv_config_default<int>(config,"setcon",3);
  eoserv_config_default<int>(config,"setcha",3);
  eoserv_config_default<int>(config,"setstatpoints",3);
  eoserv_config_default<int>(config,"setskillpoints",3);
  eoserv_config_default<int>(config,"setadmin",3);
  eoserv_config_default<int>(config,"setfiance",3);
  eoserv_config_default<int>(config,"setpartner",3);
  eoserv_config_default<int>(config,"sethome",3);
  eoserv_config_default<int>(config,"setgender",3);
  eoserv_config_default<int>(config,"sethairstyle",3);
  eoserv_config_default<int>(config,"sethaircolor",3);
  eoserv_config_default<int>(config,"setrace",3);
  eoserv_config_default<int>(config,"setguild",3);
  eoserv_config_default<int>(config,"setguildrank",3);
  eoserv_config_default<int>(config,"setkarma",3);
  eoserv_config_default<int>(config,"setclass",3);
  eoserv_config_default<int>(config,"settitle",2);
  eoserv_config_default<int>(config,"strip",3);
  eoserv_config_default<int>(config,"dress",2);
  eoserv_config_default<int>(config,"undress",2);
  eoserv_config_default<int>(config,"dress2",3);
  eoserv_config_default<int>(config,"duty",3);
  eoserv_config_default<int>(config,"killnpc",4);
  eoserv_config_default<int>(config,"boardmod",1);
  eoserv_config_default<int>(config,"reports",1);
  eoserv_config_default<int>(config,"nowall",2);
  eoserv_config_default<int>(config,"seehide",3);
  eoserv_config_default<int>(config,"cmdprotect",3);
  eoserv_config_default<int>(config,"unlimitedweight",3);
  return;
}

Assistant:

void eoserv_config_validate_admin(Config& config)
{
	eoserv_config_default(config, "item"          , 1);
	eoserv_config_default(config, "npc"           , 1);
	eoserv_config_default(config, "spell"         , 1);
	eoserv_config_default(config, "class"         , 1);
	eoserv_config_default(config, "info"          , 1);
	eoserv_config_default(config, "paperdoll"     , 1);
	eoserv_config_default(config, "book"          , 1);
	eoserv_config_default(config, "inventory"     , 1);
	eoserv_config_default(config, "uptime"        , 1);
	eoserv_config_default(config, "kick"          , 1);
	eoserv_config_default(config, "skick"         , 3);
	eoserv_config_default(config, "jail"          , 1);
	eoserv_config_default(config, "unjail"        , 1);
	eoserv_config_default(config, "sjail"         , 3);
	eoserv_config_default(config, "ban"           , 2);
	eoserv_config_default(config, "sban"          , 3);
	eoserv_config_default(config, "mute"          , 1);
	eoserv_config_default(config, "smute"         , 3);
	eoserv_config_default(config, "warp"          , 2);
	eoserv_config_default(config, "warptome"      , 2);
	eoserv_config_default(config, "warpmeto"      , 2);
	eoserv_config_default(config, "hide"          , 2);
	eoserv_config_default(config, "show"          , 2);
	eoserv_config_default(config, "evacuate"      , 3);
	eoserv_config_default(config, "remap"         , 4);
	eoserv_config_default(config, "arena"         , 1);
	eoserv_config_default(config, "board"         , 1);
	eoserv_config_default(config, "shutdown"      , 4);
	eoserv_config_default(config, "rehash"        , 4);
	eoserv_config_default(config, "repub"         , 4);
	eoserv_config_default(config, "request"       , 4);
	eoserv_config_default(config, "sitem"         , 3);
	eoserv_config_default(config, "ditem"         , 3);
	eoserv_config_default(config, "snpc"          , 3);
	eoserv_config_default(config, "dnpc"          , 3);
	eoserv_config_default(config, "learn"         , 3);
	eoserv_config_default(config, "qstate"        , 3);
	eoserv_config_default(config, "quake"         , 2);
	eoserv_config_default(config, "setlevel"      , 3);
	eoserv_config_default(config, "setexp"        , 3);
	eoserv_config_default(config, "setstr"        , 3);
	eoserv_config_default(config, "setint"        , 3);
	eoserv_config_default(config, "setwis"        , 3);
	eoserv_config_default(config, "setagi"        , 3);
	eoserv_config_default(config, "setcon"        , 3);
	eoserv_config_default(config, "setcha"        , 3);
	eoserv_config_default(config, "setstatpoints" , 3);
	eoserv_config_default(config, "setskillpoints", 3);
	eoserv_config_default(config, "setadmin"      , 3);
	eoserv_config_default(config, "setfiance"     , 3);
	eoserv_config_default(config, "setpartner"    , 3);
	eoserv_config_default(config, "sethome"       , 3);
	eoserv_config_default(config, "setgender"     , 3);
	eoserv_config_default(config, "sethairstyle"  , 3);
	eoserv_config_default(config, "sethaircolor"  , 3);
	eoserv_config_default(config, "setrace"       , 3);
	eoserv_config_default(config, "setguild"      , 3);
	eoserv_config_default(config, "setguildrank"  , 3);
	eoserv_config_default(config, "setkarma"      , 3);
	eoserv_config_default(config, "setclass"      , 3);
	eoserv_config_default(config, "settitle"      , 2);
	eoserv_config_default(config, "strip"         , 3);
	eoserv_config_default(config, "dress"         , 2);
	eoserv_config_default(config, "undress"       , 2);
	eoserv_config_default(config, "dress2"        , 3);
	eoserv_config_default(config, "duty"          , 3);
	eoserv_config_default(config, "killnpc"       , 4);
	eoserv_config_default(config, "boardmod"      , 1);
	eoserv_config_default(config, "reports"       , 1);
	eoserv_config_default(config, "nowall"        , 2);
	eoserv_config_default(config, "seehide"       , 3);
	eoserv_config_default(config, "cmdprotect"    , 3);
	eoserv_config_default(config, "unlimitedweight", 3);
}